

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

Instr * __thiscall
IRBuilder::BuildCallI_Helper
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot Src1RegSlot,
          ArgSlot ArgCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  OpCode OVar1;
  bool bVar2;
  bool bVar3;
  ValueType valueType;
  RegOpnd *src1Opnd;
  JitProfilingInstr *pJVar4;
  JitProfilingInstr *this_00;
  ProfiledInstr *pPVar5;
  uint uVar6;
  StackSym *symDst;
  StackSym *local_48;
  RegOpnd *local_40;
  
  src1Opnd = BuildSrcOpnd(this,Src1RegSlot,TyVar);
  if (dstRegSlot == 0xffffffff) {
    local_40 = (RegOpnd *)0x0;
    local_48 = (StackSym *)0x0;
  }
  else {
    local_40 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    local_48 = local_40->m_sym;
  }
  bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
  bVar3 = Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode);
  if (bVar3) {
    newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);
    if (profileId == 0xffff || !bVar2) {
LAB_00497feb:
      this_00 = (JitProfilingInstr *)IR::Instr::New(newOpcode,this->m_func);
      IR::Instr::SetSrc1((Instr *)this_00,&src1Opnd->super_Opnd);
      if (local_40 == (RegOpnd *)0x0) goto LAB_00498072;
      IR::Instr::SetDst((Instr *)this_00,&local_40->super_Opnd);
    }
    else {
LAB_00497f91:
      this_00 = IR::JitProfilingInstr::New
                          (newOpcode,&local_40->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
      pJVar4 = IR::Instr::AsJitProfilingInstr(&this_00->super_Instr);
      pJVar4->profileId = profileId;
      pJVar4 = IR::Instr::AsJitProfilingInstr(&this_00->super_Instr);
      pJVar4->field_0x60 = pJVar4->field_0x60 & 0xfe | bVar3;
      pJVar4 = IR::Instr::AsJitProfilingInstr(&this_00->super_Instr);
      (pJVar4->field_2).inlineCacheIndex = inlineCacheIndex;
    }
  }
  else {
    if (profileId == 0xffff) goto LAB_00497feb;
    if (bVar2) goto LAB_00497f91;
    this_00 = (JitProfilingInstr *)
              IR::ProfiledInstr::New
                        (newOpcode,&local_40->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    pPVar5 = IR::Instr::AsProfiledInstr((Instr *)this_00);
    *(uint *)&pPVar5->u = (uint)profileId;
  }
  if (newOpcode == NewScObject && local_40 != (RegOpnd *)0x0) {
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&local_40->super_Opnd,valueType);
  }
LAB_00498072:
  if ((local_48 != (StackSym *)0x0) && ((*(uint *)&local_48->field_0x18 & 1) != 0)) {
    OVar1 = (this_00->super_Instr).m_opcode;
    uVar6 = OVar1 - 0xc4;
    if (((uVar6 < 0xb) && ((0x429U >> (uVar6 & 0x1f) & 1) != 0)) || (OVar1 == NewScObjectSpread)) {
      *(uint *)&local_48->field_0x18 = *(uint *)&local_48->field_0x18 | 6;
    }
  }
  AddInstr(this,&this_00->super_Instr,offset);
  BuildCallCommon(this,&this_00->super_Instr,symDst,ArgCount,flags);
  return &this_00->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildCallI_Helper(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot Src1RegSlot, Js::ArgSlot ArgCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    IR::Instr * instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    StackSym *      symDst;

    src1Opnd = this->BuildSrcOpnd(Src1RegSlot);
    if (dstRegSlot == Js::Constants::NoRegister)
    {
        dstOpnd = nullptr;
        symDst = nullptr;
    }
    else
    {
        dstOpnd = this->BuildDstOpnd(dstRegSlot);
        symDst = dstOpnd->m_sym;
    }

    const bool jitProfiling = m_func->DoSimpleJitDynamicProfile();
    bool profiledReturn = false;
    if (Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode))
    {
        profiledReturn = true;
        newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);

        // If we're profiling in the jitted code we want to propagate the profileId
        //   If we're using profile data instead of collecting it, we don't want to
        //   use the profile data from a return type call (this was previously done in IRBuilder::BuildProfiledCallI)
        if (!jitProfiling)
        {
            profileId = Js::Constants::NoProfileId;
        }
    }

    if (profileId != Js::Constants::NoProfileId)
    {
        if (jitProfiling)
        {
            // In SimpleJit we want this call to be a profiled call after being jitted
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
            instr->AsJitProfilingInstr()->isProfiledReturnCall = profiledReturn;
            instr->AsJitProfilingInstr()->inlineCacheIndex = inlineCacheIndex;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsProfiledInstr()->u.profileId = profileId;
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(src1Opnd);
        if (dstOpnd != nullptr)
        {
            instr->SetDst(dstOpnd);
        }
    }

    if (dstOpnd && newOpcode == Js::OpCode::NewScObject)
    {
        dstOpnd->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
    }

    if (symDst && symDst->m_isSingleDef)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::NewScObject:
        case Js::OpCode::NewScObjectSpread:
        case Js::OpCode::NewScObjectLiteral:
        case Js::OpCode::NewScObjArray:
        case Js::OpCode::NewScObjArraySpread:
            symDst->m_isSafeThis = true;
            symDst->m_isNotNumber = true;
            break;
        }
    }

    this->AddInstr(instr, offset);

    this->BuildCallCommon(instr, symDst, ArgCount, flags);

    return instr;
}